

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

bool __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::AddChunk
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t capacity)

{
  CrtAllocator *pCVar1;
  ChunkHeader *pCVar2;
  
  if (this->baseAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->baseAllocator_ = pCVar1;
    this->ownBaseAllocator_ = pCVar1;
  }
  if (capacity + 0x18 == 0) {
    pCVar2 = (ChunkHeader *)0x0;
  }
  else {
    pCVar2 = (ChunkHeader *)malloc(capacity + 0x18);
  }
  if (pCVar2 != (ChunkHeader *)0x0) {
    pCVar2->capacity = capacity;
    pCVar2->size = 0;
    pCVar2->next = this->chunkHead_;
    this->chunkHead_ = pCVar2;
  }
  return pCVar2 != (ChunkHeader *)0x0;
}

Assistant:

bool AddChunk(size_t capacity) {
        if (!baseAllocator_)
            ownBaseAllocator_ = baseAllocator_ = RAPIDJSON_NEW(BaseAllocator());
        if (ChunkHeader* chunk = reinterpret_cast<ChunkHeader*>(baseAllocator_->Malloc(RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + capacity))) {
            chunk->capacity = capacity;
            chunk->size = 0;
            chunk->next = chunkHead_;
            chunkHead_ =  chunk;
            return true;
        }
        else
            return false;
    }